

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSetInner::ToEquivClassW
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint base,uint *tblidx,
          CharSet<char16_t> *result)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint local_38;
  uint i;
  uint delta;
  CharSet<char16_t> *result_local;
  uint *tblidx_local;
  uint base_local;
  uint level_local;
  ArenaAllocator *allocator_local;
  CharSetInner *this_local;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x238,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar3 = CharSetNode::lim(level - 1);
  tblidx_local._0_4_ = base;
  for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
    if (this->children[local_38] != (CharSetNode *)0x0) {
      (*this->children[local_38]->_vptr_CharSetNode[7])
                (this->children[local_38],allocator,(ulong)(level - 1),(ulong)(uint)tblidx_local,
                 tblidx,result);
    }
    tblidx_local._0_4_ = uVar3 + 1 + (uint)tblidx_local;
  }
  return;
}

Assistant:

void CharSetInner::ToEquivClassW(ArenaAllocator* allocator, uint level, uint base, uint& tblidx, CharSet<char16>& result) const
    {
        Assert(level > 0);
        level--;
        uint delta = lim(level) + 1;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != nullptr)
            {
                children[i]->ToEquivClassW(allocator, level, base, tblidx, result);
            }
            base += delta;
        }
    }